

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O2

void __thiscall BPlusTree::PrintStats(BPlusTree *this)

{
  uint32_t *node;
  element_type *peVar1;
  int iVar2;
  ostream *poVar3;
  BPlusTree *pBVar4;
  BPlusTree local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  peVar1 = (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  poVar3 = std::operator<<((ostream *)&std::cout,"------------- B+ Tree Statistic --------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (peVar1 != (element_type *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Parmeter N of B+ Tree: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Number of nodes in B+ Tree: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->numNodes);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Height of B+ Tree: ");
    iVar2 = GetHeight(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Content of root node: ");
    std::endl<char,std::char_traits<char>>(poVar3);
    pBVar4 = &local_48;
    std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)this);
    PrintNodeWithoutPtr(pBVar4,&local_48.root);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    poVar3 = std::operator<<((ostream *)&std::cout,"Content of 1st child node: ");
    std::endl<char,std::char_traits<char>>(poVar3);
    node = &local_48.size;
    pBVar4 = (BPlusTree *)node;
    std::static_pointer_cast<Node,void>((shared_ptr<void> *)node);
    PrintNodeWithoutPtr(pBVar4,(shared_ptr<Node> *)node);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    poVar3 = std::operator<<((ostream *)&std::cout,"----------------------------------------------")
    ;
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"B+ tree is empty");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"----------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void BPlusTree::PrintStats() {
    if (root == nullptr) {
        std::cout << "------------- B+ Tree Statistic --------------" << std::endl;
        std::cout << "B+ tree is empty" << std::endl;
        std::cout << "----------------------------------------------" << std::endl;
        return;
    }
    std::cout << "------------- B+ Tree Statistic --------------" << std::endl;
    std::cout << "Parmeter N of B+ Tree: " << size << std::endl;
    std::cout << "Number of nodes in B+ Tree: " << numNodes << std::endl;
    std::cout << "Height of B+ Tree: " << GetHeight() << std::endl;
    std::cout << "Content of root node: " << std::endl;
    PrintNodeWithoutPtr(root);
    std::cout << "Content of 1st child node: " << std::endl;
    PrintNodeWithoutPtr(std::static_pointer_cast<Node>(root->ptrs[0]));
    std::cout << "----------------------------------------------" << std::endl;
}